

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigs.h
# Opt level: O0

void __thiscall
sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::eraseEntries
          (BasicSignal<void_(),_std::lock_guard<std::mutex>_> *this,
          function<bool_(__gnu_cxx::__normal_iterator<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry_*,_std::vector<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry,_std::allocator<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry>_>_>)>
          *pred)

{
  bool bVar1;
  iterator it_00;
  iterator this_00;
  function<bool_(__gnu_cxx::__normal_iterator<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry_*,_std::vector<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry,_std::allocator<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry>_>_>)>
  *in_RSI;
  __normal_iterator<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry_*,_std::vector<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry,_std::allocator<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry>_>_>
  in_RDI;
  iterator it;
  
  it_00 = std::
          vector<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry,_std::allocator<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry>_>
          ::begin((vector<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry,_std::allocator<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry>_>
                   *)in_RSI);
  while( true ) {
    this_00 = std::
              vector<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry,_std::allocator<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry>_>
              ::end((vector<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry,_std::allocator<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry>_>
                     *)in_RSI);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry_*,_std::vector<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry,_std::allocator<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry>_>_>
                        *)in_RDI._M_current,
                       (__normal_iterator<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry_*,_std::vector<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry,_std::allocator<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry>_>_>
                        *)in_RSI);
    if (!bVar1) break;
    bVar1 = std::
            function<bool_(__gnu_cxx::__normal_iterator<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry_*,_std::vector<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry,_std::allocator<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry>_>_>)>
            ::operator()(in_RSI,in_RDI);
    if (bVar1) {
      it_00 = eraseEntry(this_00._M_current,it_00);
    }
    else {
      __gnu_cxx::
      __normal_iterator<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry_*,_std::vector<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry,_std::allocator<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry>_>_>
      ::operator++((__normal_iterator<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry_*,_std::vector<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry,_std::allocator<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry>_>_>
                    *)&stack0xffffffffffffffe8);
    }
  }
  return;
}

Assistant:

void eraseEntries(std::function<bool(typename Cont::iterator)> pred = [](auto /*unused*/) {
    return true;
  }) noexcept
  {
    for (auto it = entries.begin(); it != entries.end();) {
      if (pred(it)) {
        it = eraseEntry(it);
      }
      else {
        ++it;
      }
    }
  }